

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feebumper_tests.cpp
# Opt level: O2

void __thiscall
wallet::feebumper::feebumper_tests::external_max_weight_test::test_method
          (external_max_weight_test *this)

{
  long lVar1;
  long in_FS_OFFSET;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  allocator<char> local_ed;
  allocator<char> local_ec;
  allocator_type local_eb;
  allocator<char> local_ea;
  allocator<char> local_e9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e8;
  allocator<char> local_c9;
  string local_c8;
  string local_a8 [32];
  string local_88 [32];
  string local_68;
  string local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,
             "453042021f03c8957c5ce12940ee6e3333ecc3f633d9a1ac53a55b3ce0351c617fa96abe021f0dccdcce3ef45a63998be9ec748b561baf077b8e862941d0cd5ec08f5afe68012102fccfeb395f0ecd3a77e7bc31c3bc61dc987418b18e395d441057b42ca043f22c"
             ,(allocator<char> *)&local_e8);
  local_68._M_dataplus._M_p = (pointer)0x0;
  local_68._M_string_length = 0;
  local_68.field_2._M_allocated_capacity = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"76a914f60dcfd3392b28adc7662669603641f578eed72d88ac",&local_c9);
  CheckMaxWeightComputation
            (&local_c8,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_68,&local_40,0x251);
  std::__cxx11::string::~string((string *)&local_40);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_68);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"160014001dca1b22c599b5a56a87c78417ad2ff39552f1",&local_c9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,
             "3042021f5443c58eaf45f3e5ef46f8516f966b334a7d497cedda4edb2b9fad57c90c3b021f63a77cb56cde848e2e2dd20b487eec2f53101f634193786083f60b4d23a82301"
             ,&local_e9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_a8,"026cfe86116f161057deb240201d6b82ebd4f161e0200d63dc9aca65a1d6b38bb7",&local_ea
            );
  __l._M_len = 2;
  __l._M_array = &local_c8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_e8,__l,&local_eb);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"a9147c8ab5ad7708b97ccb6b483d57aba48ee85214df87",&local_ec);
  CheckMaxWeightComputation(&local_40,&local_e8,&local_68,0x16c);
  std::__cxx11::string::~string((string *)&local_68);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_e8);
  lVar1 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&local_c8._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"",&local_c9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,
             "3042021f0f8906f0394979d5b737134773e5b88bf036c7d63542301d600ab677ba5a59021f0e9fe07e62c113045fa1c1532e2914720e8854d189c4f5b8c88f57956b704401"
             ,&local_e9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_a8,"0359edba11ed1a0568094a6296a16c4d5ee4c8cfe2f5e2e6826871b5ecf8188f79",&local_ea
            );
  __l_00._M_len = 2;
  __l_00._M_array = &local_c8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_e8,__l_00,&local_eb);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"00149961a78658030cc824af4c54fbf5294bec0cabdd",&local_ec);
  CheckMaxWeightComputation(&local_40,&local_e8,&local_68,0x110);
  std::__cxx11::string::~string((string *)&local_68);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_e8);
  lVar1 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&local_c8._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"",&local_c9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,
             "3042021f5c4c29e6b686aae5b6d0751e90208592ea96d26bc81d78b0d3871a94a21fa8021f74dc2f971e438ccece8699c8fd15704c41df219ab37b63264f2147d15c34d801"
             ,&local_e9);
  std::__cxx11::string::string<std::allocator<char>>(local_a8,"01",&local_ea);
  std::__cxx11::string::string<std::allocator<char>>
            (local_88,
             "6321024cf55e52ec8af7866617dc4e7ff8433758e98799906d80e066c6f32033f685f967029000b275210214827893e2dcbe4ad6c20bd743288edad21100404eb7f52ccd6062fd0e7808f268ac"
             ,(allocator<char> *)&local_eb);
  __l_01._M_len = 3;
  __l_01._M_array = &local_c8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_e8,__l_01,(allocator_type *)&local_ec);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,
             "002089e84892873c679b1129edea246e484fd914c2601f776d4f2f4a001eb8059703",&local_ed);
  CheckMaxWeightComputation(&local_40,&local_e8,&local_68,0x13e);
  std::__cxx11::string::~string((string *)&local_68);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_e8);
  lVar1 = 0x40;
  do {
    std::__cxx11::string::~string((string *)((long)&local_c8._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::~string((string *)&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(external_max_weight_test)
{
    // P2PKH
    CheckMaxWeightComputation("453042021f03c8957c5ce12940ee6e3333ecc3f633d9a1ac53a55b3ce0351c617fa96abe021f0dccdcce3ef45a63998be9ec748b561baf077b8e862941d0cd5ec08f5afe68012102fccfeb395f0ecd3a77e7bc31c3bc61dc987418b18e395d441057b42ca043f22c", {}, "76a914f60dcfd3392b28adc7662669603641f578eed72d88ac", 593);
    // P2SH-P2WPKH
    CheckMaxWeightComputation("160014001dca1b22c599b5a56a87c78417ad2ff39552f1", {"3042021f5443c58eaf45f3e5ef46f8516f966b334a7d497cedda4edb2b9fad57c90c3b021f63a77cb56cde848e2e2dd20b487eec2f53101f634193786083f60b4d23a82301", "026cfe86116f161057deb240201d6b82ebd4f161e0200d63dc9aca65a1d6b38bb7"}, "a9147c8ab5ad7708b97ccb6b483d57aba48ee85214df87", 364);
    // P2WPKH
    CheckMaxWeightComputation("", {"3042021f0f8906f0394979d5b737134773e5b88bf036c7d63542301d600ab677ba5a59021f0e9fe07e62c113045fa1c1532e2914720e8854d189c4f5b8c88f57956b704401", "0359edba11ed1a0568094a6296a16c4d5ee4c8cfe2f5e2e6826871b5ecf8188f79"}, "00149961a78658030cc824af4c54fbf5294bec0cabdd", 272);
    // P2WSH HTLC
    CheckMaxWeightComputation("", {"3042021f5c4c29e6b686aae5b6d0751e90208592ea96d26bc81d78b0d3871a94a21fa8021f74dc2f971e438ccece8699c8fd15704c41df219ab37b63264f2147d15c34d801", "01", "6321024cf55e52ec8af7866617dc4e7ff8433758e98799906d80e066c6f32033f685f967029000b275210214827893e2dcbe4ad6c20bd743288edad21100404eb7f52ccd6062fd0e7808f268ac"}, "002089e84892873c679b1129edea246e484fd914c2601f776d4f2f4a001eb8059703", 318);
}